

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  uint uVar1;
  int i;
  long lVar2;
  uint uVar3;
  uint uVar4;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ecdsa_signature_normalize_cold_2();
  }
  else if (sigin != (secp256k1_ecdsa_signature *)0x0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar3 = (uint)sigin->data[lVar2] | uVar1 << 8;
      uVar1 = uVar3 - (uVar3 / 0xd + (uVar3 / 0xd) * 0xc);
      if (uVar3 < 0xd) {
        uVar1 = uVar3;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = (uint)sigin->data[lVar2 + 0x20] | uVar3 << 8;
      uVar3 = uVar4 - (uVar4 / 0xd + (uVar4 / 0xd) * 0xc);
      if (uVar4 < 0xd) {
        uVar3 = uVar4;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x20);
    if (sigout == (secp256k1_ecdsa_signature *)0x0) {
      return (uint)(6 < uVar3);
    }
    uVar4 = 0xd - uVar3;
    if (uVar3 < 7) {
      uVar4 = uVar3;
    }
    sigout->data[0xc] = '\0';
    sigout->data[0xd] = '\0';
    sigout->data[0xe] = '\0';
    sigout->data[0xf] = '\0';
    sigout->data[0x10] = '\0';
    sigout->data[0x11] = '\0';
    sigout->data[0x12] = '\0';
    sigout->data[0x13] = '\0';
    sigout->data[0x14] = '\0';
    sigout->data[0x15] = '\0';
    sigout->data[0x16] = '\0';
    sigout->data[0x17] = '\0';
    sigout->data[0x18] = '\0';
    sigout->data[0x19] = '\0';
    sigout->data[0x1a] = '\0';
    sigout->data[0x1b] = '\0';
    sigout->data[0] = '\0';
    sigout->data[1] = '\0';
    sigout->data[2] = '\0';
    sigout->data[3] = '\0';
    sigout->data[4] = '\0';
    sigout->data[5] = '\0';
    sigout->data[6] = '\0';
    sigout->data[7] = '\0';
    sigout->data[8] = '\0';
    sigout->data[9] = '\0';
    sigout->data[10] = '\0';
    sigout->data[0xb] = '\0';
    sigout->data[0xc] = '\0';
    sigout->data[0xd] = '\0';
    sigout->data[0xe] = '\0';
    sigout->data[0xf] = '\0';
    sigout->data[0x1c] = (uchar)(uVar1 >> 0x18);
    sigout->data[0x1d] = (uchar)(uVar1 >> 0x10);
    sigout->data[0x1e] = (uchar)(uVar1 >> 8);
    sigout->data[0x1f] = (uchar)uVar1;
    sigout->data[0x20] = '\0';
    sigout->data[0x21] = '\0';
    sigout->data[0x22] = '\0';
    sigout->data[0x23] = '\0';
    sigout->data[0x24] = '\0';
    sigout->data[0x25] = '\0';
    sigout->data[0x26] = '\0';
    sigout->data[0x27] = '\0';
    sigout->data[0x28] = '\0';
    sigout->data[0x29] = '\0';
    sigout->data[0x2a] = '\0';
    sigout->data[0x2b] = '\0';
    sigout->data[0x2c] = '\0';
    sigout->data[0x2d] = '\0';
    sigout->data[0x2e] = '\0';
    sigout->data[0x2f] = '\0';
    sigout->data[0x2c] = '\0';
    sigout->data[0x2d] = '\0';
    sigout->data[0x2e] = '\0';
    sigout->data[0x2f] = '\0';
    sigout->data[0x30] = '\0';
    sigout->data[0x31] = '\0';
    sigout->data[0x32] = '\0';
    sigout->data[0x33] = '\0';
    sigout->data[0x34] = '\0';
    sigout->data[0x35] = '\0';
    sigout->data[0x36] = '\0';
    sigout->data[0x37] = '\0';
    sigout->data[0x38] = '\0';
    sigout->data[0x39] = '\0';
    sigout->data[0x3a] = '\0';
    sigout->data[0x3b] = '\0';
    *(uint *)(sigout->data + 0x3c) =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    return (uint)(6 < uVar3);
  }
  secp256k1_ecdsa_signature_normalize_cold_1();
  return 0;
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}